

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_20c1::DataDump<unsigned_int>::Run
          (DataDump<unsigned_int> *this,istream *input_stream)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  uint data;
  char buffer [128];
  char local_cd;
  uint local_cc;
  string *local_c8;
  istream *local_c0;
  char local_b8 [136];
  int iVar6;
  
  iVar5 = this->minimum_index_;
  local_c0 = input_stream;
  bVar1 = sptk::ReadStream<unsigned_int>(&local_cc,input_stream);
  bVar2 = true;
  if (bVar1) {
    local_c8 = &this->print_format_;
    do {
      bVar2 = sptk::SnPrintf<unsigned_int>(local_cc,local_c8,0x80,local_b8);
      if (!bVar2) {
        return bVar2;
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      local_cd = '\t';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_cd,1);
      sVar4 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_b8,sVar4);
      local_cd = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_cd,1);
      iVar6 = this->minimum_index_ + -1;
      if (this->maximum_index_ != iVar5) {
        iVar6 = iVar5;
      }
      if (this->maximum_index_ == -1) {
        iVar6 = iVar5;
      }
      iVar5 = iVar6 + 1;
      bVar1 = sptk::ReadStream<unsigned_int>(&local_cc,local_c0);
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    T data;
    for (int index(minimum_index_); sptk::ReadStream(&data, input_stream);
         ++index) {
      // Format data.
      if (!sptk::SnPrintf(data, print_format_, sizeof(buffer), buffer)) {
        return false;
      }

      // Dump data. Note that std::endl makes the execution speed slow.
      std::cout << index << '\t' << buffer << '\n';

      // Initialize index.
      if (maximum_index_ != kMagicNumberForEndOfFile &&
          maximum_index_ == index) {
        index = minimum_index_ - 1;
      }
    }
    return true;
  }